

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O3

void MakeWaveTables(void)

{
  char cVar1;
  char cVar3;
  short sVar9;
  ushort uVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [16];
  int iVar23;
  long lVar24;
  char cVar25;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  double dVar26;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar60;
  short sVar61;
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined4 uVar79;
  undefined1 auVar83 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  short sVar94;
  short sVar95;
  undefined4 uVar96;
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  char cVar2;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined4 uVar62;
  undefined6 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar69 [14];
  undefined1 auVar70 [14];
  undefined1 auVar71 [14];
  undefined1 auVar72 [14];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined6 uVar80;
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar84 [14];
  undefined1 auVar85 [14];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined6 uVar97;
  undefined8 uVar98;
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar105 [14];
  undefined1 auVar106 [14];
  undefined1 auVar107 [14];
  undefined1 auVar108 [14];
  undefined1 auVar109 [14];
  undefined1 auVar110 [14];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  
  lVar24 = 0;
  do {
    dVar26 = sin((double)(int)lVar24 * 6.283184 * 0.00390625);
    gWaveModelTable[0][lVar24] = (char)(int)(dVar26 * 64.0);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x100);
  cVar25 = '\0';
  cVar27 = '\x01';
  cVar28 = '\x02';
  cVar29 = '\x03';
  cVar30 = '\x04';
  cVar31 = '\x05';
  cVar32 = '\x06';
  cVar33 = '\a';
  cVar34 = '\b';
  cVar35 = '\t';
  cVar36 = '\n';
  cVar37 = '\v';
  cVar38 = '\f';
  cVar39 = '\r';
  cVar40 = '\x0e';
  cVar41 = '\x0f';
  lVar24 = 0;
  do {
    gWaveModelTable[1][lVar24] = cVar25;
    gWaveModelTable[1][lVar24 + 1] = cVar27;
    gWaveModelTable[1][lVar24 + 2] = cVar28;
    gWaveModelTable[1][lVar24 + 3] = cVar29;
    gWaveModelTable[1][lVar24 + 4] = cVar30;
    gWaveModelTable[1][lVar24 + 5] = cVar31;
    gWaveModelTable[1][lVar24 + 6] = cVar32;
    gWaveModelTable[1][lVar24 + 7] = cVar33;
    gWaveModelTable[1][lVar24 + 8] = cVar34;
    gWaveModelTable[1][lVar24 + 9] = cVar35;
    gWaveModelTable[1][lVar24 + 10] = cVar36;
    gWaveModelTable[1][lVar24 + 0xb] = cVar37;
    gWaveModelTable[1][lVar24 + 0xc] = cVar38;
    gWaveModelTable[1][lVar24 + 0xd] = cVar39;
    gWaveModelTable[1][lVar24 + 0xe] = cVar40;
    gWaveModelTable[1][lVar24 + 0xf] = cVar41;
    lVar24 = lVar24 + 0x10;
    cVar25 = cVar25 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
    cVar39 = cVar39 + '\x10';
    cVar40 = cVar40 + '\x10';
    cVar41 = cVar41 + '\x10';
  } while (lVar24 != 0x40);
  cVar25 = '\0';
  cVar27 = '\x01';
  cVar28 = '\x02';
  cVar29 = '\x03';
  cVar30 = '\x04';
  cVar31 = '\x05';
  cVar32 = '\x06';
  cVar33 = '\a';
  cVar34 = '\b';
  cVar35 = '\t';
  cVar36 = '\n';
  cVar37 = '\v';
  cVar38 = '\f';
  cVar39 = '\r';
  cVar40 = '\x0e';
  cVar41 = '\x0f';
  lVar24 = 0;
  do {
    gWaveModelTable[1][lVar24 + 0x40] = '@' - cVar25;
    gWaveModelTable[1][lVar24 + 0x41] = '@' - cVar27;
    gWaveModelTable[1][lVar24 + 0x42] = '@' - cVar28;
    gWaveModelTable[1][lVar24 + 0x43] = '@' - cVar29;
    gWaveModelTable[1][lVar24 + 0x44] = '@' - cVar30;
    gWaveModelTable[1][lVar24 + 0x45] = '@' - cVar31;
    gWaveModelTable[1][lVar24 + 0x46] = '@' - cVar32;
    gWaveModelTable[1][lVar24 + 0x47] = '@' - cVar33;
    gWaveModelTable[1][lVar24 + 0x48] = '@' - cVar34;
    gWaveModelTable[1][lVar24 + 0x49] = '@' - cVar35;
    gWaveModelTable[1][lVar24 + 0x4a] = '@' - cVar36;
    gWaveModelTable[1][lVar24 + 0x4b] = '@' - cVar37;
    gWaveModelTable[1][lVar24 + 0x4c] = '@' - cVar38;
    gWaveModelTable[1][lVar24 + 0x4d] = '@' - cVar39;
    gWaveModelTable[1][lVar24 + 0x4e] = '@' - cVar40;
    gWaveModelTable[1][lVar24 + 0x4f] = '@' - cVar41;
    auVar22 = _DAT_001207d0;
    lVar24 = lVar24 + 0x10;
    cVar25 = cVar25 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
    cVar39 = cVar39 + '\x10';
    cVar40 = cVar40 + '\x10';
    cVar41 = cVar41 + '\x10';
  } while (lVar24 != 0x80);
  gWaveModelTable[1][0xc0] = -0x40;
  gWaveModelTable[1][0xc1] = -0x3f;
  gWaveModelTable[1][0xc2] = -0x3e;
  gWaveModelTable[1][0xc3] = -0x3d;
  gWaveModelTable[1][0xc4] = -0x3c;
  gWaveModelTable[1][0xc5] = -0x3b;
  gWaveModelTable[1][0xc6] = -0x3a;
  gWaveModelTable[1][199] = -0x39;
  gWaveModelTable[1][200] = -0x38;
  gWaveModelTable[1][0xc9] = -0x37;
  gWaveModelTable[1][0xca] = -0x36;
  gWaveModelTable[1][0xcb] = -0x35;
  gWaveModelTable[1][0xcc] = -0x34;
  gWaveModelTable[1][0xcd] = -0x33;
  gWaveModelTable[1][0xce] = -0x32;
  gWaveModelTable[1][0xcf] = -0x31;
  gWaveModelTable[1][0xd0] = -0x30;
  gWaveModelTable[1][0xd1] = -0x2f;
  gWaveModelTable[1][0xd2] = -0x2e;
  gWaveModelTable[1][0xd3] = -0x2d;
  gWaveModelTable[1][0xd4] = -0x2c;
  gWaveModelTable[1][0xd5] = -0x2b;
  gWaveModelTable[1][0xd6] = -0x2a;
  gWaveModelTable[1][0xd7] = -0x29;
  gWaveModelTable[1][0xd8] = -0x28;
  gWaveModelTable[1][0xd9] = -0x27;
  gWaveModelTable[1][0xda] = -0x26;
  gWaveModelTable[1][0xdb] = -0x25;
  gWaveModelTable[1][0xdc] = -0x24;
  gWaveModelTable[1][0xdd] = -0x23;
  gWaveModelTable[1][0xde] = -0x22;
  gWaveModelTable[1][0xdf] = -0x21;
  gWaveModelTable[1][0xe0] = -0x20;
  gWaveModelTable[1][0xe1] = -0x1f;
  gWaveModelTable[1][0xe2] = -0x1e;
  gWaveModelTable[1][0xe3] = -0x1d;
  gWaveModelTable[1][0xe4] = -0x1c;
  gWaveModelTable[1][0xe5] = -0x1b;
  gWaveModelTable[1][0xe6] = -0x1a;
  gWaveModelTable[1][0xe7] = -0x19;
  gWaveModelTable[1][0xe8] = -0x18;
  gWaveModelTable[1][0xe9] = -0x17;
  gWaveModelTable[1][0xea] = -0x16;
  gWaveModelTable[1][0xeb] = -0x15;
  gWaveModelTable[1][0xec] = -0x14;
  gWaveModelTable[1][0xed] = -0x13;
  gWaveModelTable[1][0xee] = -0x12;
  gWaveModelTable[1][0xef] = -0x11;
  gWaveModelTable[1][0xf0] = -0x10;
  gWaveModelTable[1][0xf1] = -0xf;
  gWaveModelTable[1][0xf2] = -0xe;
  gWaveModelTable[1][0xf3] = -0xd;
  gWaveModelTable[1][0xf4] = -0xc;
  gWaveModelTable[1][0xf5] = -0xb;
  gWaveModelTable[1][0xf6] = -10;
  gWaveModelTable[1][0xf7] = -9;
  gWaveModelTable[1][0xf8] = -8;
  gWaveModelTable[1][0xf9] = -7;
  gWaveModelTable[1][0xfa] = -6;
  gWaveModelTable[1][0xfb] = -5;
  gWaveModelTable[1][0xfc] = -4;
  gWaveModelTable[1][0xfd] = -3;
  gWaveModelTable[1][0xfe] = -2;
  gWaveModelTable[1][0xff] = -1;
  uVar42 = 0xe;
  uVar43 = 0xf;
  uVar44 = 0xc;
  uVar45 = 0xd;
  uVar46 = 10;
  uVar47 = 0xb;
  uVar48 = 8;
  uVar49 = 9;
  uVar50 = 6;
  uVar51 = 7;
  uVar52 = 4;
  uVar53 = 5;
  uVar54 = 2;
  uVar55 = 3;
  uVar56 = 0;
  uVar57 = 1;
  lVar24 = 0;
  do {
    auVar58._0_8_ = uVar42 >> 1;
    auVar58._8_8_ = uVar43 >> 1;
    auVar86._0_8_ = uVar50 >> 1;
    auVar86._8_8_ = uVar51 >> 1;
    auVar111._0_8_ = uVar54 >> 1;
    auVar111._8_8_ = uVar55 >> 1;
    auVar73._0_8_ = uVar56 >> 1;
    auVar73._8_8_ = uVar57 >> 1;
    auVar73 = auVar73 & auVar22;
    auVar111 = auVar111 & auVar22;
    sVar9 = auVar73._0_2_;
    cVar25 = (0 < sVar9) * (sVar9 < 0x100) * auVar73[0] - (0xff < sVar9);
    sVar9 = auVar73._2_2_;
    sVar60 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar73[2] - (0xff < sVar9),cVar25);
    sVar9 = auVar73._4_2_;
    cVar27 = (0 < sVar9) * (sVar9 < 0x100) * auVar73[4] - (0xff < sVar9);
    uVar10 = auVar73._6_2_;
    uVar62 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar73[6] - (0xff < uVar10),
                      CONCAT12(cVar27,sVar60));
    sVar9 = auVar73._8_2_;
    cVar28 = (0 < sVar9) * (sVar9 < 0x100) * auVar73[8] - (0xff < sVar9);
    sVar9 = auVar73._10_2_;
    uVar63 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar73[10] - (0xff < sVar9),
                      CONCAT14(cVar28,uVar62));
    sVar9 = auVar73._12_2_;
    cVar29 = (0 < sVar9) * (sVar9 < 0x100) * auVar73[0xc] - (0xff < sVar9);
    sVar9 = auVar73._14_2_;
    uVar64 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar73[0xe] - (0xff < sVar9),
                      CONCAT16(cVar29,uVar63));
    sVar9 = auVar111._0_2_;
    cVar30 = (0 < sVar9) * (sVar9 < 0x100) * auVar111[0] - (0xff < sVar9);
    sVar9 = auVar111._2_2_;
    auVar65._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar111[2] - (0xff < sVar9),
                  CONCAT18(cVar30,uVar64));
    sVar9 = auVar111._4_2_;
    cVar31 = (0 < sVar9) * (sVar9 < 0x100) * auVar111[4] - (0xff < sVar9);
    auVar65[10] = cVar31;
    uVar10 = auVar111._6_2_;
    auVar65[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar111[6] - (0xff < uVar10);
    sVar9 = auVar111._8_2_;
    cVar32 = (0 < sVar9) * (sVar9 < 0x100) * auVar111[8] - (0xff < sVar9);
    auVar69[0xc] = cVar32;
    auVar69._0_12_ = auVar65;
    sVar9 = auVar111._10_2_;
    auVar69[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar111[10] - (0xff < sVar9);
    sVar9 = auVar111._12_2_;
    cVar33 = (0 < sVar9) * (sVar9 < 0x100) * auVar111[0xc] - (0xff < sVar9);
    auVar74[0xe] = cVar33;
    auVar74._0_14_ = auVar69;
    sVar9 = auVar111._14_2_;
    auVar74[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar111[0xe] - (0xff < sVar9);
    auVar112._0_8_ = uVar52 >> 1;
    auVar112._8_8_ = uVar53 >> 1;
    auVar112 = auVar112 & auVar22;
    auVar86 = auVar86 & auVar22;
    sVar9 = auVar112._0_2_;
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * auVar112[0] - (0xff < sVar9);
    sVar9 = auVar112._2_2_;
    sVar94 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar112[2] - (0xff < sVar9),cVar41);
    sVar9 = auVar112._4_2_;
    cVar34 = (0 < sVar9) * (sVar9 < 0x100) * auVar112[4] - (0xff < sVar9);
    uVar10 = auVar112._6_2_;
    uVar79 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar112[6] - (0xff < uVar10),
                      CONCAT12(cVar34,sVar94));
    sVar9 = auVar112._8_2_;
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * auVar112[8] - (0xff < sVar9);
    sVar9 = auVar112._10_2_;
    uVar80 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar112[10] - (0xff < sVar9),
                      CONCAT14(cVar40,uVar79));
    sVar9 = auVar112._12_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * auVar112[0xc] - (0xff < sVar9);
    sVar9 = auVar112._14_2_;
    uVar81 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar112[0xe] - (0xff < sVar9),
                      CONCAT16(cVar39,uVar80));
    sVar9 = auVar86._0_2_;
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * auVar86[0] - (0xff < sVar9);
    sVar9 = auVar86._2_2_;
    auVar99._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar86[2] - (0xff < sVar9),
                  CONCAT18(cVar38,uVar81));
    sVar9 = auVar86._4_2_;
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * auVar86[4] - (0xff < sVar9);
    auVar99[10] = cVar37;
    uVar10 = auVar86._6_2_;
    auVar99[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar86[6] - (0xff < uVar10);
    sVar9 = auVar86._8_2_;
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * auVar86[8] - (0xff < sVar9);
    auVar105[0xc] = cVar36;
    auVar105._0_12_ = auVar99;
    sVar9 = auVar86._10_2_;
    auVar105[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar86[10] - (0xff < sVar9);
    sVar9 = auVar86._12_2_;
    cVar35 = (0 < sVar9) * (sVar9 < 0x100) * auVar86[0xc] - (0xff < sVar9);
    auVar113[0xe] = cVar35;
    auVar113._0_14_ = auVar105;
    sVar9 = auVar86._14_2_;
    auVar113[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar86[0xe] - (0xff < sVar9);
    auVar87._0_8_ = uVar46 >> 1;
    auVar87._8_8_ = uVar47 >> 1;
    cVar1 = (0 < sVar60) * (sVar60 < 0x100) * cVar25 - (0xff < sVar60);
    sVar9 = (short)((uint)uVar62 >> 0x10);
    sVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar27 - (0xff < sVar9),cVar1);
    sVar9 = (short)((uint6)uVar63 >> 0x20);
    cVar2 = (0 < sVar9) * (sVar9 < 0x100) * cVar28 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar64 >> 0x30);
    uVar62 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar29 - (0xff < sVar9),CONCAT12(cVar2,sVar61)
                     );
    sVar9 = (short)((unkuint10)auVar65._0_10_ >> 0x40);
    cVar30 = (0 < sVar9) * (sVar9 < 0x100) * cVar30 - (0xff < sVar9);
    sVar9 = auVar65._10_2_;
    uVar63 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar31 - (0xff < sVar9),
                      CONCAT14(cVar30,uVar62));
    sVar9 = auVar69._12_2_;
    cVar31 = (0 < sVar9) * (sVar9 < 0x100) * cVar32 - (0xff < sVar9);
    sVar9 = auVar74._14_2_;
    uVar64 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar33 - (0xff < sVar9),
                      CONCAT16(cVar31,uVar63));
    cVar29 = (0 < sVar94) * (sVar94 < 0x100) * cVar41 - (0xff < sVar94);
    sVar9 = (short)((uint)uVar79 >> 0x10);
    auVar66._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar34 - (0xff < sVar9),CONCAT18(cVar29,uVar64));
    sVar9 = (short)((uint6)uVar80 >> 0x20);
    cVar28 = (0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9);
    auVar66[10] = cVar28;
    sVar9 = (short)((ulong)uVar81 >> 0x30);
    auVar66[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar39 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar99._0_10_ >> 0x40);
    cVar27 = (0 < sVar9) * (sVar9 < 0x100) * cVar38 - (0xff < sVar9);
    auVar70[0xc] = cVar27;
    auVar70._0_12_ = auVar66;
    sVar9 = auVar99._10_2_;
    auVar70[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar37 - (0xff < sVar9);
    sVar9 = auVar105._12_2_;
    cVar25 = (0 < sVar9) * (sVar9 < 0x100) * cVar36 - (0xff < sVar9);
    auVar75[0xe] = cVar25;
    auVar75._0_14_ = auVar70;
    sVar9 = auVar113._14_2_;
    auVar75[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar35 - (0xff < sVar9);
    auVar114._0_8_ = uVar48 >> 1;
    auVar114._8_8_ = uVar49 >> 1;
    auVar114 = auVar114 & auVar22;
    auVar87 = auVar87 & auVar22;
    sVar9 = auVar114._0_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * auVar114[0] - (0xff < sVar9);
    sVar9 = auVar114._2_2_;
    sVar94 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar114[2] - (0xff < sVar9),cVar39);
    sVar9 = auVar114._4_2_;
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * auVar114[4] - (0xff < sVar9);
    uVar10 = auVar114._6_2_;
    uVar96 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar114[6] - (0xff < uVar10),
                      CONCAT12(cVar38,sVar94));
    sVar9 = auVar114._8_2_;
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * auVar114[8] - (0xff < sVar9);
    sVar9 = auVar114._10_2_;
    uVar97 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar114[10] - (0xff < sVar9),
                      CONCAT14(cVar37,uVar96));
    sVar9 = auVar114._12_2_;
    cVar32 = (0 < sVar9) * (sVar9 < 0x100) * auVar114[0xc] - (0xff < sVar9);
    sVar9 = auVar114._14_2_;
    uVar98 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar114[0xe] - (0xff < sVar9),
                      CONCAT16(cVar32,uVar97));
    sVar9 = auVar87._0_2_;
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * auVar87[0] - (0xff < sVar9);
    sVar9 = auVar87._2_2_;
    auVar100._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar87[2] - (0xff < sVar9),
                  CONCAT18(cVar36,uVar98));
    sVar9 = auVar87._4_2_;
    cVar35 = (0 < sVar9) * (sVar9 < 0x100) * auVar87[4] - (0xff < sVar9);
    auVar100[10] = cVar35;
    uVar10 = auVar87._6_2_;
    auVar100[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar87[6] - (0xff < uVar10);
    sVar9 = auVar87._8_2_;
    cVar34 = (0 < sVar9) * (sVar9 < 0x100) * auVar87[8] - (0xff < sVar9);
    auVar106[0xc] = cVar34;
    auVar106._0_12_ = auVar100;
    sVar9 = auVar87._10_2_;
    auVar106[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar87[10] - (0xff < sVar9);
    sVar9 = auVar87._12_2_;
    cVar33 = (0 < sVar9) * (sVar9 < 0x100) * auVar87[0xc] - (0xff < sVar9);
    auVar115[0xe] = cVar33;
    auVar115._0_14_ = auVar106;
    sVar9 = auVar87._14_2_;
    auVar115[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar87[0xe] - (0xff < sVar9);
    auVar88._0_8_ = uVar44 >> 1;
    auVar88._8_8_ = uVar45 >> 1;
    auVar88 = auVar88 & auVar22;
    auVar58 = auVar58 & auVar22;
    sVar9 = auVar88._0_2_;
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0] - (0xff < sVar9);
    sVar9 = auVar88._2_2_;
    sVar60 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar88[2] - (0xff < sVar9),cVar3);
    sVar9 = auVar88._4_2_;
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[4] - (0xff < sVar9);
    uVar10 = auVar88._6_2_;
    uVar79 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar88[6] - (0xff < uVar10),
                      CONCAT12(cVar40,sVar60));
    sVar9 = auVar88._8_2_;
    cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[8] - (0xff < sVar9);
    sVar9 = auVar88._10_2_;
    uVar80 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar88[10] - (0xff < sVar9),
                      CONCAT14(cVar4,uVar79));
    sVar9 = auVar88._12_2_;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0xc] - (0xff < sVar9);
    sVar9 = auVar88._14_2_;
    uVar81 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar88[0xe] - (0xff < sVar9),
                      CONCAT16(cVar5,uVar80));
    sVar9 = auVar58._0_2_;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[0] - (0xff < sVar9);
    sVar9 = auVar58._2_2_;
    auVar82._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar58[2] - (0xff < sVar9),CONCAT18(cVar6,uVar81)
                 );
    sVar9 = auVar58._4_2_;
    cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[4] - (0xff < sVar9);
    auVar82[10] = cVar7;
    uVar10 = auVar58._6_2_;
    auVar82[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar58[6] - (0xff < uVar10);
    sVar9 = auVar58._8_2_;
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[8] - (0xff < sVar9);
    auVar84[0xc] = cVar41;
    auVar84._0_12_ = auVar82;
    sVar9 = auVar58._10_2_;
    auVar84[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar58[10] - (0xff < sVar9);
    sVar9 = auVar58._12_2_;
    cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[0xc] - (0xff < sVar9);
    auVar89[0xe] = cVar8;
    auVar89._0_14_ = auVar84;
    sVar9 = auVar58._14_2_;
    auVar89[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar58[0xe] - (0xff < sVar9);
    cVar39 = (0 < sVar94) * (sVar94 < 0x100) * cVar39 - (0xff < sVar94);
    sVar9 = (short)((uint)uVar96 >> 0x10);
    sVar95 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar38 - (0xff < sVar9),cVar39);
    sVar9 = (short)((uint6)uVar97 >> 0x20);
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * cVar37 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar98 >> 0x30);
    uVar96 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar32 - (0xff < sVar9),
                      CONCAT12(cVar37,sVar95));
    sVar9 = (short)((unkuint10)auVar100._0_10_ >> 0x40);
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * cVar36 - (0xff < sVar9);
    sVar9 = auVar100._10_2_;
    uVar97 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar35 - (0xff < sVar9),
                      CONCAT14(cVar36,uVar96));
    sVar9 = auVar106._12_2_;
    cVar34 = (0 < sVar9) * (sVar9 < 0x100) * cVar34 - (0xff < sVar9);
    sVar9 = auVar115._14_2_;
    uVar98 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar33 - (0xff < sVar9),
                      CONCAT16(cVar34,uVar97));
    cVar33 = (0 < sVar60) * (sVar60 < 0x100) * cVar3 - (0xff < sVar60);
    sVar9 = (short)((uint)uVar79 >> 0x10);
    auVar101._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9),CONCAT18(cVar33,uVar98));
    sVar9 = (short)((uint6)uVar80 >> 0x20);
    cVar35 = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
    auVar101[10] = cVar35;
    sVar9 = (short)((ulong)uVar81 >> 0x30);
    auVar101[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar82._0_10_ >> 0x40);
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
    auVar107[0xc] = cVar38;
    auVar107._0_12_ = auVar101;
    sVar9 = auVar82._10_2_;
    auVar107[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9);
    sVar9 = auVar84._12_2_;
    cVar32 = (0 < sVar9) * (sVar9 < 0x100) * cVar41 - (0xff < sVar9);
    auVar116[0xe] = cVar32;
    auVar116._0_14_ = auVar107;
    sVar9 = auVar89._14_2_;
    auVar116[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar8 - (0xff < sVar9);
    sVar9 = (short)((uint)uVar62 >> 0x10);
    sVar60 = (short)((uint6)uVar63 >> 0x20);
    sVar94 = (short)((ulong)uVar64 >> 0x30);
    sVar11 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
    sVar12 = auVar66._10_2_;
    sVar13 = auVar70._12_2_;
    sVar14 = auVar75._14_2_;
    sVar15 = (short)((uint)uVar96 >> 0x10);
    sVar16 = (short)((uint6)uVar97 >> 0x20);
    sVar17 = (short)((ulong)uVar98 >> 0x30);
    sVar18 = (short)((unkuint10)auVar101._0_10_ >> 0x40);
    sVar19 = auVar101._10_2_;
    sVar20 = auVar107._12_2_;
    sVar21 = auVar116._14_2_;
    gWaveModelTable[2][lVar24] = ((0 < sVar61) * (sVar61 < 0x100) * cVar1 - (0xff < sVar61)) + -0x40
    ;
    gWaveModelTable[2][lVar24 + 1] =
         ((0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9)) + -0x40;
    gWaveModelTable[2][lVar24 + 2] =
         ((0 < sVar60) * (sVar60 < 0x100) * cVar30 - (0xff < sVar60)) + -0x40;
    gWaveModelTable[2][lVar24 + 3] =
         ((0 < sVar94) * (sVar94 < 0x100) * cVar31 - (0xff < sVar94)) + -0x40;
    gWaveModelTable[2][lVar24 + 4] =
         ((0 < sVar11) * (sVar11 < 0x100) * cVar29 - (0xff < sVar11)) + -0x40;
    gWaveModelTable[2][lVar24 + 5] =
         ((0 < sVar12) * (sVar12 < 0x100) * cVar28 - (0xff < sVar12)) + -0x40;
    gWaveModelTable[2][lVar24 + 6] =
         ((0 < sVar13) * (sVar13 < 0x100) * cVar27 - (0xff < sVar13)) + -0x40;
    gWaveModelTable[2][lVar24 + 7] =
         ((0 < sVar14) * (sVar14 < 0x100) * cVar25 - (0xff < sVar14)) + -0x40;
    gWaveModelTable[2][lVar24 + 8] =
         ((0 < sVar95) * (sVar95 < 0x100) * cVar39 - (0xff < sVar95)) + -0x40;
    gWaveModelTable[2][lVar24 + 9] =
         ((0 < sVar15) * (sVar15 < 0x100) * cVar37 - (0xff < sVar15)) + -0x40;
    gWaveModelTable[2][lVar24 + 10] =
         ((0 < sVar16) * (sVar16 < 0x100) * cVar36 - (0xff < sVar16)) + -0x40;
    gWaveModelTable[2][lVar24 + 0xb] =
         ((0 < sVar17) * (sVar17 < 0x100) * cVar34 - (0xff < sVar17)) + -0x40;
    gWaveModelTable[2][lVar24 + 0xc] =
         ((0 < sVar18) * (sVar18 < 0x100) * cVar33 - (0xff < sVar18)) + -0x40;
    gWaveModelTable[2][lVar24 + 0xd] =
         ((0 < sVar19) * (sVar19 < 0x100) * cVar35 - (0xff < sVar19)) + -0x40;
    gWaveModelTable[2][lVar24 + 0xe] =
         ((0 < sVar20) * (sVar20 < 0x100) * cVar38 - (0xff < sVar20)) + -0x40;
    gWaveModelTable[2][lVar24 + 0xf] =
         ((0 < sVar21) * (sVar21 < 0x100) * cVar32 - (0xff < sVar21)) + -0x40;
    lVar24 = lVar24 + 0x10;
    uVar56 = uVar56 + 0x10;
    uVar57 = uVar57 + 0x10;
    uVar54 = uVar54 + 0x10;
    uVar55 = uVar55 + 0x10;
    uVar52 = uVar52 + 0x10;
    uVar53 = uVar53 + 0x10;
    uVar50 = uVar50 + 0x10;
    uVar51 = uVar51 + 0x10;
    uVar48 = uVar48 + 0x10;
    uVar49 = uVar49 + 0x10;
    uVar46 = uVar46 + 0x10;
    uVar47 = uVar47 + 0x10;
    uVar44 = uVar44 + 0x10;
    uVar45 = uVar45 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar43 = uVar43 + 0x10;
  } while (lVar24 != 0x100);
  uVar42 = 0xe;
  uVar43 = 0xf;
  uVar44 = 0xc;
  uVar45 = 0xd;
  uVar46 = 10;
  uVar47 = 0xb;
  uVar48 = 8;
  uVar49 = 9;
  uVar50 = 6;
  uVar51 = 7;
  uVar52 = 4;
  uVar53 = 5;
  uVar54 = 2;
  uVar55 = 3;
  uVar56 = 0;
  uVar57 = 1;
  lVar24 = 0;
  do {
    auVar59._0_8_ = uVar42 >> 1;
    auVar59._8_8_ = uVar43 >> 1;
    auVar90._0_8_ = uVar50 >> 1;
    auVar90._8_8_ = uVar51 >> 1;
    auVar117._0_8_ = uVar54 >> 1;
    auVar117._8_8_ = uVar55 >> 1;
    auVar76._0_8_ = uVar56 >> 1;
    auVar76._8_8_ = uVar57 >> 1;
    auVar76 = auVar76 & auVar22;
    auVar117 = auVar117 & auVar22;
    sVar9 = auVar76._0_2_;
    cVar25 = (0 < sVar9) * (sVar9 < 0x100) * auVar76[0] - (0xff < sVar9);
    sVar9 = auVar76._2_2_;
    sVar60 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar76[2] - (0xff < sVar9),cVar25);
    sVar9 = auVar76._4_2_;
    cVar27 = (0 < sVar9) * (sVar9 < 0x100) * auVar76[4] - (0xff < sVar9);
    uVar10 = auVar76._6_2_;
    uVar62 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar76[6] - (0xff < uVar10),
                      CONCAT12(cVar27,sVar60));
    sVar9 = auVar76._8_2_;
    cVar28 = (0 < sVar9) * (sVar9 < 0x100) * auVar76[8] - (0xff < sVar9);
    sVar9 = auVar76._10_2_;
    uVar63 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar76[10] - (0xff < sVar9),
                      CONCAT14(cVar28,uVar62));
    sVar9 = auVar76._12_2_;
    cVar29 = (0 < sVar9) * (sVar9 < 0x100) * auVar76[0xc] - (0xff < sVar9);
    sVar9 = auVar76._14_2_;
    uVar64 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar76[0xe] - (0xff < sVar9),
                      CONCAT16(cVar29,uVar63));
    sVar9 = auVar117._0_2_;
    cVar30 = (0 < sVar9) * (sVar9 < 0x100) * auVar117[0] - (0xff < sVar9);
    sVar9 = auVar117._2_2_;
    auVar67._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar117[2] - (0xff < sVar9),
                  CONCAT18(cVar30,uVar64));
    sVar9 = auVar117._4_2_;
    cVar31 = (0 < sVar9) * (sVar9 < 0x100) * auVar117[4] - (0xff < sVar9);
    auVar67[10] = cVar31;
    uVar10 = auVar117._6_2_;
    auVar67[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar117[6] - (0xff < uVar10);
    sVar9 = auVar117._8_2_;
    cVar32 = (0 < sVar9) * (sVar9 < 0x100) * auVar117[8] - (0xff < sVar9);
    auVar71[0xc] = cVar32;
    auVar71._0_12_ = auVar67;
    sVar9 = auVar117._10_2_;
    auVar71[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar117[10] - (0xff < sVar9);
    sVar9 = auVar117._12_2_;
    cVar33 = (0 < sVar9) * (sVar9 < 0x100) * auVar117[0xc] - (0xff < sVar9);
    auVar77[0xe] = cVar33;
    auVar77._0_14_ = auVar71;
    sVar9 = auVar117._14_2_;
    auVar77[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar117[0xe] - (0xff < sVar9);
    auVar118._0_8_ = uVar52 >> 1;
    auVar118._8_8_ = uVar53 >> 1;
    auVar118 = auVar118 & auVar22;
    auVar90 = auVar90 & auVar22;
    sVar9 = auVar118._0_2_;
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * auVar118[0] - (0xff < sVar9);
    sVar9 = auVar118._2_2_;
    sVar94 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar118[2] - (0xff < sVar9),cVar41);
    sVar9 = auVar118._4_2_;
    cVar34 = (0 < sVar9) * (sVar9 < 0x100) * auVar118[4] - (0xff < sVar9);
    uVar10 = auVar118._6_2_;
    uVar79 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar118[6] - (0xff < uVar10),
                      CONCAT12(cVar34,sVar94));
    sVar9 = auVar118._8_2_;
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * auVar118[8] - (0xff < sVar9);
    sVar9 = auVar118._10_2_;
    uVar80 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar118[10] - (0xff < sVar9),
                      CONCAT14(cVar40,uVar79));
    sVar9 = auVar118._12_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * auVar118[0xc] - (0xff < sVar9);
    sVar9 = auVar118._14_2_;
    uVar81 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar118[0xe] - (0xff < sVar9),
                      CONCAT16(cVar39,uVar80));
    sVar9 = auVar90._0_2_;
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * auVar90[0] - (0xff < sVar9);
    sVar9 = auVar90._2_2_;
    auVar102._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar90[2] - (0xff < sVar9),
                  CONCAT18(cVar38,uVar81));
    sVar9 = auVar90._4_2_;
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * auVar90[4] - (0xff < sVar9);
    auVar102[10] = cVar37;
    uVar10 = auVar90._6_2_;
    auVar102[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar90[6] - (0xff < uVar10);
    sVar9 = auVar90._8_2_;
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * auVar90[8] - (0xff < sVar9);
    auVar108[0xc] = cVar36;
    auVar108._0_12_ = auVar102;
    sVar9 = auVar90._10_2_;
    auVar108[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar90[10] - (0xff < sVar9);
    sVar9 = auVar90._12_2_;
    cVar35 = (0 < sVar9) * (sVar9 < 0x100) * auVar90[0xc] - (0xff < sVar9);
    auVar119[0xe] = cVar35;
    auVar119._0_14_ = auVar108;
    sVar9 = auVar90._14_2_;
    auVar119[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar90[0xe] - (0xff < sVar9);
    auVar91._0_8_ = uVar46 >> 1;
    auVar91._8_8_ = uVar47 >> 1;
    cVar1 = (0 < sVar60) * (sVar60 < 0x100) * cVar25 - (0xff < sVar60);
    sVar9 = (short)((uint)uVar62 >> 0x10);
    sVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar27 - (0xff < sVar9),cVar1);
    sVar9 = (short)((uint6)uVar63 >> 0x20);
    cVar2 = (0 < sVar9) * (sVar9 < 0x100) * cVar28 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar64 >> 0x30);
    uVar62 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar29 - (0xff < sVar9),CONCAT12(cVar2,sVar61)
                     );
    sVar9 = (short)((unkuint10)auVar67._0_10_ >> 0x40);
    cVar30 = (0 < sVar9) * (sVar9 < 0x100) * cVar30 - (0xff < sVar9);
    sVar9 = auVar67._10_2_;
    uVar63 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar31 - (0xff < sVar9),
                      CONCAT14(cVar30,uVar62));
    sVar9 = auVar71._12_2_;
    cVar31 = (0 < sVar9) * (sVar9 < 0x100) * cVar32 - (0xff < sVar9);
    sVar9 = auVar77._14_2_;
    uVar64 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar33 - (0xff < sVar9),
                      CONCAT16(cVar31,uVar63));
    cVar29 = (0 < sVar94) * (sVar94 < 0x100) * cVar41 - (0xff < sVar94);
    sVar9 = (short)((uint)uVar79 >> 0x10);
    auVar68._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar34 - (0xff < sVar9),CONCAT18(cVar29,uVar64));
    sVar9 = (short)((uint6)uVar80 >> 0x20);
    cVar28 = (0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9);
    auVar68[10] = cVar28;
    sVar9 = (short)((ulong)uVar81 >> 0x30);
    auVar68[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar39 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar102._0_10_ >> 0x40);
    cVar27 = (0 < sVar9) * (sVar9 < 0x100) * cVar38 - (0xff < sVar9);
    auVar72[0xc] = cVar27;
    auVar72._0_12_ = auVar68;
    sVar9 = auVar102._10_2_;
    auVar72[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar37 - (0xff < sVar9);
    sVar9 = auVar108._12_2_;
    cVar25 = (0 < sVar9) * (sVar9 < 0x100) * cVar36 - (0xff < sVar9);
    auVar78[0xe] = cVar25;
    auVar78._0_14_ = auVar72;
    sVar9 = auVar119._14_2_;
    auVar78[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar35 - (0xff < sVar9);
    auVar120._0_8_ = uVar48 >> 1;
    auVar120._8_8_ = uVar49 >> 1;
    auVar120 = auVar120 & auVar22;
    auVar91 = auVar91 & auVar22;
    sVar9 = auVar120._0_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * auVar120[0] - (0xff < sVar9);
    sVar9 = auVar120._2_2_;
    sVar94 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar120[2] - (0xff < sVar9),cVar39);
    sVar9 = auVar120._4_2_;
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * auVar120[4] - (0xff < sVar9);
    uVar10 = auVar120._6_2_;
    uVar96 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar120[6] - (0xff < uVar10),
                      CONCAT12(cVar38,sVar94));
    sVar9 = auVar120._8_2_;
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * auVar120[8] - (0xff < sVar9);
    sVar9 = auVar120._10_2_;
    uVar97 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar120[10] - (0xff < sVar9),
                      CONCAT14(cVar37,uVar96));
    sVar9 = auVar120._12_2_;
    cVar32 = (0 < sVar9) * (sVar9 < 0x100) * auVar120[0xc] - (0xff < sVar9);
    sVar9 = auVar120._14_2_;
    uVar98 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar120[0xe] - (0xff < sVar9),
                      CONCAT16(cVar32,uVar97));
    sVar9 = auVar91._0_2_;
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * auVar91[0] - (0xff < sVar9);
    sVar9 = auVar91._2_2_;
    auVar103._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar91[2] - (0xff < sVar9),
                  CONCAT18(cVar36,uVar98));
    sVar9 = auVar91._4_2_;
    cVar35 = (0 < sVar9) * (sVar9 < 0x100) * auVar91[4] - (0xff < sVar9);
    auVar103[10] = cVar35;
    uVar10 = auVar91._6_2_;
    auVar103[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar91[6] - (0xff < uVar10);
    sVar9 = auVar91._8_2_;
    cVar34 = (0 < sVar9) * (sVar9 < 0x100) * auVar91[8] - (0xff < sVar9);
    auVar109[0xc] = cVar34;
    auVar109._0_12_ = auVar103;
    sVar9 = auVar91._10_2_;
    auVar109[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar91[10] - (0xff < sVar9);
    sVar9 = auVar91._12_2_;
    cVar33 = (0 < sVar9) * (sVar9 < 0x100) * auVar91[0xc] - (0xff < sVar9);
    auVar121[0xe] = cVar33;
    auVar121._0_14_ = auVar109;
    sVar9 = auVar91._14_2_;
    auVar121[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar91[0xe] - (0xff < sVar9);
    auVar92._0_8_ = uVar44 >> 1;
    auVar92._8_8_ = uVar45 >> 1;
    auVar92 = auVar92 & auVar22;
    auVar59 = auVar59 & auVar22;
    sVar9 = auVar92._0_2_;
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar92[0] - (0xff < sVar9);
    sVar9 = auVar92._2_2_;
    sVar60 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar92[2] - (0xff < sVar9),cVar3);
    sVar9 = auVar92._4_2_;
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * auVar92[4] - (0xff < sVar9);
    uVar10 = auVar92._6_2_;
    uVar79 = CONCAT13((uVar10 != 0) * (uVar10 < 0x100) * auVar92[6] - (0xff < uVar10),
                      CONCAT12(cVar40,sVar60));
    sVar9 = auVar92._8_2_;
    cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar92[8] - (0xff < sVar9);
    sVar9 = auVar92._10_2_;
    uVar80 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar92[10] - (0xff < sVar9),
                      CONCAT14(cVar4,uVar79));
    sVar9 = auVar92._12_2_;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar92[0xc] - (0xff < sVar9);
    sVar9 = auVar92._14_2_;
    uVar81 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar92[0xe] - (0xff < sVar9),
                      CONCAT16(cVar5,uVar80));
    sVar9 = auVar59._0_2_;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar59[0] - (0xff < sVar9);
    sVar9 = auVar59._2_2_;
    auVar83._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar59[2] - (0xff < sVar9),CONCAT18(cVar6,uVar81)
                 );
    sVar9 = auVar59._4_2_;
    cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar59[4] - (0xff < sVar9);
    auVar83[10] = cVar7;
    uVar10 = auVar59._6_2_;
    auVar83[0xb] = (uVar10 != 0) * (uVar10 < 0x100) * auVar59[6] - (0xff < uVar10);
    sVar9 = auVar59._8_2_;
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * auVar59[8] - (0xff < sVar9);
    auVar85[0xc] = cVar41;
    auVar85._0_12_ = auVar83;
    sVar9 = auVar59._10_2_;
    auVar85[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar59[10] - (0xff < sVar9);
    sVar9 = auVar59._12_2_;
    cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar59[0xc] - (0xff < sVar9);
    auVar93[0xe] = cVar8;
    auVar93._0_14_ = auVar85;
    sVar9 = auVar59._14_2_;
    auVar93[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar59[0xe] - (0xff < sVar9);
    cVar39 = (0 < sVar94) * (sVar94 < 0x100) * cVar39 - (0xff < sVar94);
    sVar9 = (short)((uint)uVar96 >> 0x10);
    sVar95 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar38 - (0xff < sVar9),cVar39);
    sVar9 = (short)((uint6)uVar97 >> 0x20);
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * cVar37 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar98 >> 0x30);
    uVar96 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar32 - (0xff < sVar9),
                      CONCAT12(cVar37,sVar95));
    sVar9 = (short)((unkuint10)auVar103._0_10_ >> 0x40);
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * cVar36 - (0xff < sVar9);
    sVar9 = auVar103._10_2_;
    uVar97 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar35 - (0xff < sVar9),
                      CONCAT14(cVar36,uVar96));
    sVar9 = auVar109._12_2_;
    cVar34 = (0 < sVar9) * (sVar9 < 0x100) * cVar34 - (0xff < sVar9);
    sVar9 = auVar121._14_2_;
    uVar98 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar33 - (0xff < sVar9),
                      CONCAT16(cVar34,uVar97));
    cVar33 = (0 < sVar60) * (sVar60 < 0x100) * cVar3 - (0xff < sVar60);
    sVar9 = (short)((uint)uVar79 >> 0x10);
    auVar104._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9),CONCAT18(cVar33,uVar98));
    sVar9 = (short)((uint6)uVar80 >> 0x20);
    cVar35 = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
    auVar104[10] = cVar35;
    sVar9 = (short)((ulong)uVar81 >> 0x30);
    auVar104[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar83._0_10_ >> 0x40);
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
    auVar110[0xc] = cVar38;
    auVar110._0_12_ = auVar104;
    sVar9 = auVar83._10_2_;
    auVar110[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9);
    sVar9 = auVar85._12_2_;
    cVar32 = (0 < sVar9) * (sVar9 < 0x100) * cVar41 - (0xff < sVar9);
    auVar122[0xe] = cVar32;
    auVar122._0_14_ = auVar110;
    sVar9 = auVar93._14_2_;
    auVar122[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar8 - (0xff < sVar9);
    sVar9 = (short)((uint)uVar62 >> 0x10);
    sVar60 = (short)((uint6)uVar63 >> 0x20);
    sVar94 = (short)((ulong)uVar64 >> 0x30);
    sVar11 = (short)((unkuint10)auVar68._0_10_ >> 0x40);
    sVar12 = auVar68._10_2_;
    sVar13 = auVar72._12_2_;
    sVar14 = auVar78._14_2_;
    sVar15 = (short)((uint)uVar96 >> 0x10);
    sVar16 = (short)((uint6)uVar97 >> 0x20);
    sVar17 = (short)((ulong)uVar98 >> 0x30);
    sVar18 = (short)((unkuint10)auVar104._0_10_ >> 0x40);
    sVar19 = auVar104._10_2_;
    sVar20 = auVar110._12_2_;
    sVar21 = auVar122._14_2_;
    gWaveModelTable[3][lVar24] = '@' - ((0 < sVar61) * (sVar61 < 0x100) * cVar1 - (0xff < sVar61));
    gWaveModelTable[3][lVar24 + 1] = '@' - ((0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9));
    gWaveModelTable[3][lVar24 + 2] =
         '@' - ((0 < sVar60) * (sVar60 < 0x100) * cVar30 - (0xff < sVar60));
    gWaveModelTable[3][lVar24 + 3] =
         '@' - ((0 < sVar94) * (sVar94 < 0x100) * cVar31 - (0xff < sVar94));
    gWaveModelTable[3][lVar24 + 4] =
         '@' - ((0 < sVar11) * (sVar11 < 0x100) * cVar29 - (0xff < sVar11));
    gWaveModelTable[3][lVar24 + 5] =
         '@' - ((0 < sVar12) * (sVar12 < 0x100) * cVar28 - (0xff < sVar12));
    gWaveModelTable[3][lVar24 + 6] =
         '@' - ((0 < sVar13) * (sVar13 < 0x100) * cVar27 - (0xff < sVar13));
    gWaveModelTable[3][lVar24 + 7] =
         '@' - ((0 < sVar14) * (sVar14 < 0x100) * cVar25 - (0xff < sVar14));
    gWaveModelTable[3][lVar24 + 8] =
         '@' - ((0 < sVar95) * (sVar95 < 0x100) * cVar39 - (0xff < sVar95));
    gWaveModelTable[3][lVar24 + 9] =
         '@' - ((0 < sVar15) * (sVar15 < 0x100) * cVar37 - (0xff < sVar15));
    gWaveModelTable[3][lVar24 + 10] =
         '@' - ((0 < sVar16) * (sVar16 < 0x100) * cVar36 - (0xff < sVar16));
    gWaveModelTable[3][lVar24 + 0xb] =
         '@' - ((0 < sVar17) * (sVar17 < 0x100) * cVar34 - (0xff < sVar17));
    gWaveModelTable[3][lVar24 + 0xc] =
         '@' - ((0 < sVar18) * (sVar18 < 0x100) * cVar33 - (0xff < sVar18));
    gWaveModelTable[3][lVar24 + 0xd] =
         '@' - ((0 < sVar19) * (sVar19 < 0x100) * cVar35 - (0xff < sVar19));
    gWaveModelTable[3][lVar24 + 0xe] =
         '@' - ((0 < sVar20) * (sVar20 < 0x100) * cVar38 - (0xff < sVar20));
    gWaveModelTable[3][lVar24 + 0xf] =
         '@' - ((0 < sVar21) * (sVar21 < 0x100) * cVar32 - (0xff < sVar21));
    lVar24 = lVar24 + 0x10;
    uVar56 = uVar56 + 0x10;
    uVar57 = uVar57 + 0x10;
    uVar54 = uVar54 + 0x10;
    uVar55 = uVar55 + 0x10;
    uVar52 = uVar52 + 0x10;
    uVar53 = uVar53 + 0x10;
    uVar50 = uVar50 + 0x10;
    uVar51 = uVar51 + 0x10;
    uVar48 = uVar48 + 0x10;
    uVar49 = uVar49 + 0x10;
    uVar46 = uVar46 + 0x10;
    uVar47 = uVar47 + 0x10;
    uVar44 = uVar44 + 0x10;
    uVar45 = uVar45 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar43 = uVar43 + 0x10;
  } while (lVar24 != 0x100);
  gWaveModelTable[4][0x70] = '@';
  gWaveModelTable[4][0x71] = '@';
  gWaveModelTable[4][0x72] = '@';
  gWaveModelTable[4][0x73] = '@';
  gWaveModelTable[4][0x74] = '@';
  gWaveModelTable[4][0x75] = '@';
  gWaveModelTable[4][0x76] = '@';
  gWaveModelTable[4][0x77] = '@';
  gWaveModelTable[4][0x78] = '@';
  gWaveModelTable[4][0x79] = '@';
  gWaveModelTable[4][0x7a] = '@';
  gWaveModelTable[4][0x7b] = '@';
  gWaveModelTable[4][0x7c] = '@';
  gWaveModelTable[4][0x7d] = '@';
  gWaveModelTable[4][0x7e] = '@';
  gWaveModelTable[4][0x7f] = '@';
  gWaveModelTable[4][0x60] = '@';
  gWaveModelTable[4][0x61] = '@';
  gWaveModelTable[4][0x62] = '@';
  gWaveModelTable[4][99] = '@';
  gWaveModelTable[4][100] = '@';
  gWaveModelTable[4][0x65] = '@';
  gWaveModelTable[4][0x66] = '@';
  gWaveModelTable[4][0x67] = '@';
  gWaveModelTable[4][0x68] = '@';
  gWaveModelTable[4][0x69] = '@';
  gWaveModelTable[4][0x6a] = '@';
  gWaveModelTable[4][0x6b] = '@';
  gWaveModelTable[4][0x6c] = '@';
  gWaveModelTable[4][0x6d] = '@';
  gWaveModelTable[4][0x6e] = '@';
  gWaveModelTable[4][0x6f] = '@';
  gWaveModelTable[4][0x50] = '@';
  gWaveModelTable[4][0x51] = '@';
  gWaveModelTable[4][0x52] = '@';
  gWaveModelTable[4][0x53] = '@';
  gWaveModelTable[4][0x54] = '@';
  gWaveModelTable[4][0x55] = '@';
  gWaveModelTable[4][0x56] = '@';
  gWaveModelTable[4][0x57] = '@';
  gWaveModelTable[4][0x58] = '@';
  gWaveModelTable[4][0x59] = '@';
  gWaveModelTable[4][0x5a] = '@';
  gWaveModelTable[4][0x5b] = '@';
  gWaveModelTable[4][0x5c] = '@';
  gWaveModelTable[4][0x5d] = '@';
  gWaveModelTable[4][0x5e] = '@';
  gWaveModelTable[4][0x5f] = '@';
  gWaveModelTable[4][0x40] = '@';
  gWaveModelTable[4][0x41] = '@';
  gWaveModelTable[4][0x42] = '@';
  gWaveModelTable[4][0x43] = '@';
  gWaveModelTable[4][0x44] = '@';
  gWaveModelTable[4][0x45] = '@';
  gWaveModelTable[4][0x46] = '@';
  gWaveModelTable[4][0x47] = '@';
  gWaveModelTable[4][0x48] = '@';
  gWaveModelTable[4][0x49] = '@';
  gWaveModelTable[4][0x4a] = '@';
  gWaveModelTable[4][0x4b] = '@';
  gWaveModelTable[4][0x4c] = '@';
  gWaveModelTable[4][0x4d] = '@';
  gWaveModelTable[4][0x4e] = '@';
  gWaveModelTable[4][0x4f] = '@';
  gWaveModelTable[4][0x30] = '@';
  gWaveModelTable[4][0x31] = '@';
  gWaveModelTable[4][0x32] = '@';
  gWaveModelTable[4][0x33] = '@';
  gWaveModelTable[4][0x34] = '@';
  gWaveModelTable[4][0x35] = '@';
  gWaveModelTable[4][0x36] = '@';
  gWaveModelTable[4][0x37] = '@';
  gWaveModelTable[4][0x38] = '@';
  gWaveModelTable[4][0x39] = '@';
  gWaveModelTable[4][0x3a] = '@';
  gWaveModelTable[4][0x3b] = '@';
  gWaveModelTable[4][0x3c] = '@';
  gWaveModelTable[4][0x3d] = '@';
  gWaveModelTable[4][0x3e] = '@';
  gWaveModelTable[4][0x3f] = '@';
  gWaveModelTable[4][0x20] = '@';
  gWaveModelTable[4][0x21] = '@';
  gWaveModelTable[4][0x22] = '@';
  gWaveModelTable[4][0x23] = '@';
  gWaveModelTable[4][0x24] = '@';
  gWaveModelTable[4][0x25] = '@';
  gWaveModelTable[4][0x26] = '@';
  gWaveModelTable[4][0x27] = '@';
  gWaveModelTable[4][0x28] = '@';
  gWaveModelTable[4][0x29] = '@';
  gWaveModelTable[4][0x2a] = '@';
  gWaveModelTable[4][0x2b] = '@';
  gWaveModelTable[4][0x2c] = '@';
  gWaveModelTable[4][0x2d] = '@';
  gWaveModelTable[4][0x2e] = '@';
  gWaveModelTable[4][0x2f] = '@';
  gWaveModelTable[4][0x10] = '@';
  gWaveModelTable[4][0x11] = '@';
  gWaveModelTable[4][0x12] = '@';
  gWaveModelTable[4][0x13] = '@';
  gWaveModelTable[4][0x14] = '@';
  gWaveModelTable[4][0x15] = '@';
  gWaveModelTable[4][0x16] = '@';
  gWaveModelTable[4][0x17] = '@';
  gWaveModelTable[4][0x18] = '@';
  gWaveModelTable[4][0x19] = '@';
  gWaveModelTable[4][0x1a] = '@';
  gWaveModelTable[4][0x1b] = '@';
  gWaveModelTable[4][0x1c] = '@';
  gWaveModelTable[4][0x1d] = '@';
  gWaveModelTable[4][0x1e] = '@';
  gWaveModelTable[4][0x1f] = '@';
  gWaveModelTable[4][0] = '@';
  gWaveModelTable[4][1] = '@';
  gWaveModelTable[4][2] = '@';
  gWaveModelTable[4][3] = '@';
  gWaveModelTable[4][4] = '@';
  gWaveModelTable[4][5] = '@';
  gWaveModelTable[4][6] = '@';
  gWaveModelTable[4][7] = '@';
  gWaveModelTable[4][8] = '@';
  gWaveModelTable[4][9] = '@';
  gWaveModelTable[4][10] = '@';
  gWaveModelTable[4][0xb] = '@';
  gWaveModelTable[4][0xc] = '@';
  gWaveModelTable[4][0xd] = '@';
  gWaveModelTable[4][0xe] = '@';
  gWaveModelTable[4][0xf] = '@';
  gWaveModelTable[4][0x80] = -0x40;
  gWaveModelTable[4][0x81] = -0x40;
  gWaveModelTable[4][0x82] = -0x40;
  gWaveModelTable[4][0x83] = -0x40;
  gWaveModelTable[4][0x84] = -0x40;
  gWaveModelTable[4][0x85] = -0x40;
  gWaveModelTable[4][0x86] = -0x40;
  gWaveModelTable[4][0x87] = -0x40;
  gWaveModelTable[4][0x88] = -0x40;
  gWaveModelTable[4][0x89] = -0x40;
  gWaveModelTable[4][0x8a] = -0x40;
  gWaveModelTable[4][0x8b] = -0x40;
  gWaveModelTable[4][0x8c] = -0x40;
  gWaveModelTable[4][0x8d] = -0x40;
  gWaveModelTable[4][0x8e] = -0x40;
  gWaveModelTable[4][0x8f] = -0x40;
  gWaveModelTable[4][0x90] = -0x40;
  gWaveModelTable[4][0x91] = -0x40;
  gWaveModelTable[4][0x92] = -0x40;
  gWaveModelTable[4][0x93] = -0x40;
  gWaveModelTable[4][0x94] = -0x40;
  gWaveModelTable[4][0x95] = -0x40;
  gWaveModelTable[4][0x96] = -0x40;
  gWaveModelTable[4][0x97] = -0x40;
  gWaveModelTable[4][0x98] = -0x40;
  gWaveModelTable[4][0x99] = -0x40;
  gWaveModelTable[4][0x9a] = -0x40;
  gWaveModelTable[4][0x9b] = -0x40;
  gWaveModelTable[4][0x9c] = -0x40;
  gWaveModelTable[4][0x9d] = -0x40;
  gWaveModelTable[4][0x9e] = -0x40;
  gWaveModelTable[4][0x9f] = -0x40;
  gWaveModelTable[4][0xa0] = -0x40;
  gWaveModelTable[4][0xa1] = -0x40;
  gWaveModelTable[4][0xa2] = -0x40;
  gWaveModelTable[4][0xa3] = -0x40;
  gWaveModelTable[4][0xa4] = -0x40;
  gWaveModelTable[4][0xa5] = -0x40;
  gWaveModelTable[4][0xa6] = -0x40;
  gWaveModelTable[4][0xa7] = -0x40;
  gWaveModelTable[4][0xa8] = -0x40;
  gWaveModelTable[4][0xa9] = -0x40;
  gWaveModelTable[4][0xaa] = -0x40;
  gWaveModelTable[4][0xab] = -0x40;
  gWaveModelTable[4][0xac] = -0x40;
  gWaveModelTable[4][0xad] = -0x40;
  gWaveModelTable[4][0xae] = -0x40;
  gWaveModelTable[4][0xaf] = -0x40;
  gWaveModelTable[4][0xb0] = -0x40;
  gWaveModelTable[4][0xb1] = -0x40;
  gWaveModelTable[4][0xb2] = -0x40;
  gWaveModelTable[4][0xb3] = -0x40;
  gWaveModelTable[4][0xb4] = -0x40;
  gWaveModelTable[4][0xb5] = -0x40;
  gWaveModelTable[4][0xb6] = -0x40;
  gWaveModelTable[4][0xb7] = -0x40;
  gWaveModelTable[4][0xb8] = -0x40;
  gWaveModelTable[4][0xb9] = -0x40;
  gWaveModelTable[4][0xba] = -0x40;
  gWaveModelTable[4][0xbb] = -0x40;
  gWaveModelTable[4][0xbc] = -0x40;
  gWaveModelTable[4][0xbd] = -0x40;
  gWaveModelTable[4][0xbe] = -0x40;
  gWaveModelTable[4][0xbf] = -0x40;
  gWaveModelTable[4][0xc0] = -0x40;
  gWaveModelTable[4][0xc1] = -0x40;
  gWaveModelTable[4][0xc2] = -0x40;
  gWaveModelTable[4][0xc3] = -0x40;
  gWaveModelTable[4][0xc4] = -0x40;
  gWaveModelTable[4][0xc5] = -0x40;
  gWaveModelTable[4][0xc6] = -0x40;
  gWaveModelTable[4][199] = -0x40;
  gWaveModelTable[4][200] = -0x40;
  gWaveModelTable[4][0xc9] = -0x40;
  gWaveModelTable[4][0xca] = -0x40;
  gWaveModelTable[4][0xcb] = -0x40;
  gWaveModelTable[4][0xcc] = -0x40;
  gWaveModelTable[4][0xcd] = -0x40;
  gWaveModelTable[4][0xce] = -0x40;
  gWaveModelTable[4][0xcf] = -0x40;
  gWaveModelTable[4][0xd0] = -0x40;
  gWaveModelTable[4][0xd1] = -0x40;
  gWaveModelTable[4][0xd2] = -0x40;
  gWaveModelTable[4][0xd3] = -0x40;
  gWaveModelTable[4][0xd4] = -0x40;
  gWaveModelTable[4][0xd5] = -0x40;
  gWaveModelTable[4][0xd6] = -0x40;
  gWaveModelTable[4][0xd7] = -0x40;
  gWaveModelTable[4][0xd8] = -0x40;
  gWaveModelTable[4][0xd9] = -0x40;
  gWaveModelTable[4][0xda] = -0x40;
  gWaveModelTable[4][0xdb] = -0x40;
  gWaveModelTable[4][0xdc] = -0x40;
  gWaveModelTable[4][0xdd] = -0x40;
  gWaveModelTable[4][0xde] = -0x40;
  gWaveModelTable[4][0xdf] = -0x40;
  gWaveModelTable[4][0xe0] = -0x40;
  gWaveModelTable[4][0xe1] = -0x40;
  gWaveModelTable[4][0xe2] = -0x40;
  gWaveModelTable[4][0xe3] = -0x40;
  gWaveModelTable[4][0xe4] = -0x40;
  gWaveModelTable[4][0xe5] = -0x40;
  gWaveModelTable[4][0xe6] = -0x40;
  gWaveModelTable[4][0xe7] = -0x40;
  gWaveModelTable[4][0xe8] = -0x40;
  gWaveModelTable[4][0xe9] = -0x40;
  gWaveModelTable[4][0xea] = -0x40;
  gWaveModelTable[4][0xeb] = -0x40;
  gWaveModelTable[4][0xec] = -0x40;
  gWaveModelTable[4][0xed] = -0x40;
  gWaveModelTable[4][0xee] = -0x40;
  gWaveModelTable[4][0xef] = -0x40;
  gWaveModelTable[4][0xf0] = -0x40;
  gWaveModelTable[4][0xf1] = -0x40;
  gWaveModelTable[4][0xf2] = -0x40;
  gWaveModelTable[4][0xf3] = -0x40;
  gWaveModelTable[4][0xf4] = -0x40;
  gWaveModelTable[4][0xf5] = -0x40;
  gWaveModelTable[4][0xf6] = -0x40;
  gWaveModelTable[4][0xf7] = -0x40;
  gWaveModelTable[4][0xf8] = -0x40;
  gWaveModelTable[4][0xf9] = -0x40;
  gWaveModelTable[4][0xfa] = -0x40;
  gWaveModelTable[4][0xfb] = -0x40;
  gWaveModelTable[4][0xfc] = -0x40;
  gWaveModelTable[4][0xfd] = -0x40;
  gWaveModelTable[4][0xfe] = -0x40;
  gWaveModelTable[4][0xff] = -0x40;
  lVar24 = 0;
  msvc_srand(0);
  do {
    iVar23 = msvc_rand();
    gWaveModelTable[5][lVar24] = (char)iVar23 / '\x02';
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x100);
  return;
}

Assistant:

void MakeWaveTables(void)
{
	int i;

	int a;

	// Sine wave
	for (i = 0; i < 0x100; ++i)
	{
		gWaveModelTable[0][i] = (signed char)(sin((i * 6.283184) / 256.0) * 64.0);
		a = gWaveModelTable[0][i];	// I have no idea what this line was meant to do
	}

	// Triangle wave
	for (a = 0, i = 0; i < 0x40; ++i)
	{
		// Upwards
		gWaveModelTable[1][i] = (a * 0x40) / 0x40;
		++a;
	}
	for (a = 0; i < 0xC0; ++i)
	{
		// Downwards
		gWaveModelTable[1][i] = 0x40 - ((a * 0x40) / 0x40);
		++a;
	}
	for (a = 0; i < 0x100; ++i)
	{
		// Back up
		gWaveModelTable[1][i] = ((a * 0x40) / 0x40) - 0x40;
		++a;
	}

	// Saw up wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[2][i] = (i / 2) - 0x40;

	// Saw down wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[3][i] = 0x40 - (i / 2);

	// Square wave
	for (i = 0; i < 0x80; ++i)
		gWaveModelTable[4][i] = 0x40;
	for (; i < 0x100; ++i)
		gWaveModelTable[4][i] = -0x40;

	// White noise wave
	msvc_srand(0);
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[5][i] = (signed char)(msvc_rand() & 0xFF) / 2;
}